

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractEuler.cpp
# Opt level: O0

M44f * anon_unknown.dwarf_342ba::matrixEulerMatrix_2(M44f *M,Order order)

{
  M44f *in_RDI;
  Eulerf f;
  Euler<float> *in_stack_00000078;
  Matrix44<float> *in_stack_00000138;
  Euler<float> *in_stack_00000140;
  
  Imath_2_5::Euler<float>::Euler((Euler<float> *)in_RDI,(Order)((ulong)in_RDI >> 0x20));
  Imath_2_5::Euler<float>::extract(in_stack_00000140,in_stack_00000138);
  Imath_2_5::Euler<float>::toMatrix44(in_stack_00000078);
  return in_RDI;
}

Assistant:

M44f
matrixEulerMatrix_2 (const M44f &M, Eulerf::Order order)
{
    Eulerf f (order);
    f.extract (M);
    return f.toMatrix44();
}